

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_pull_message(mg_session *session,mg_message_pull **message)

{
  mg_map *map;
  undefined8 *in_RSI;
  mg_map **in_RDI;
  mg_message_pull *tmessage;
  mg_map *extra;
  int status;
  mg_allocator *in_stack_ffffffffffffffc8;
  mg_allocator *in_stack_ffffffffffffffd0;
  int local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_1c = 0;
  if ((*(int *)(in_RDI + 3) != 4) ||
     (local_1c = mg_session_read_map((mg_session *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     in_RDI), local_1c == 0)) {
    map = (mg_map *)mg_allocator_malloc(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8)
    ;
    if (map == (mg_map *)0x0) {
      local_1c = -3;
    }
    else {
      map->size = 0;
      map->capacity = 0;
      *in_RSI = map;
    }
    mg_map_destroy_ca(map,in_stack_ffffffffffffffc8);
  }
  return local_1c;
}

Assistant:

int mg_session_read_pull_message(mg_session *session,
                                 mg_message_pull **message) {
  int status = 0;

  mg_map *extra = NULL;
  if (session->version == 4) {
    status = mg_session_read_map(session, &extra);
    if (status != 0) {
      return status;
    }
  }

  mg_message_pull *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_pull));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->extra = extra;
  *message = tmessage;

cleanup:
  mg_map_destroy_ca(extra, session->decoder_allocator);
  return status;
}